

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::net::http::Method_testParse_Test::TestBody(Method_testParse_Test *this)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Method local_50 [2];
  AssertionResult local_48;
  long *local_38 [2];
  long local_28 [2];
  Method local_14;
  
  local_50[0] = OPTIONS;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"OPTIONS","");
  local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
  testing::internal::CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
            ((internal *)&local_48,"Method::OPTIONS","parseMethod(\"OPTIONS\")",local_50,&local_14);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  bVar1 = local_48.success_;
  if (local_48.success_ == false) {
    testing::Message::Message((Message *)local_38);
    if (local_48.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    if (local_38[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_38[0] != (long *)0x0)) {
        (**(code **)(*local_38[0] + 8))();
      }
      local_38[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (bVar1 != false) {
    local_50[0] = GET;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"GET","");
    local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
    testing::internal::
    CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
              ((internal *)&local_48,"Method::GET","parseMethod(\"GET\")",local_50,&local_14);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    bVar1 = local_48.success_;
    if (local_48.success_ == false) {
      testing::Message::Message((Message *)local_38);
      if (local_48.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                 ,0x1b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
      if (local_38[0] != (long *)0x0) {
        cVar2 = testing::internal::IsTrue(true);
        if ((cVar2 != '\0') && (local_38[0] != (long *)0x0)) {
          (**(code **)(*local_38[0] + 8))();
        }
        local_38[0] = (long *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (bVar1 != false) {
      local_50[0] = HEAD;
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"HEAD","");
      local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
      testing::internal::
      CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                ((internal *)&local_48,"Method::HEAD","parseMethod(\"HEAD\")",local_50,&local_14);
      if (local_38[0] != local_28) {
        operator_delete(local_38[0]);
      }
      bVar1 = local_48.success_;
      if (local_48.success_ == false) {
        testing::Message::Message((Message *)local_38);
        if (local_48.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                   ,0x1c,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
        if (local_38[0] != (long *)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') && (local_38[0] != (long *)0x0)) {
            (**(code **)(*local_38[0] + 8))();
          }
          local_38[0] = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (bVar1 != false) {
        local_50[0] = POST;
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"POST","");
        local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
        testing::internal::
        CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                  ((internal *)&local_48,"Method::POST","parseMethod(\"POST\")",local_50,&local_14);
        if (local_38[0] != local_28) {
          operator_delete(local_38[0]);
        }
        bVar1 = local_48.success_;
        if (local_48.success_ == false) {
          testing::Message::Message((Message *)local_38);
          if (local_48.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                     ,0x1d,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
          if (local_38[0] != (long *)0x0) {
            cVar2 = testing::internal::IsTrue(true);
            if ((cVar2 != '\0') && (local_38[0] != (long *)0x0)) {
              (**(code **)(*local_38[0] + 8))();
            }
            local_38[0] = (long *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_48.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (bVar1 != false) {
          local_50[0] = PUT;
          local_38[0] = local_28;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"PUT","");
          local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
          testing::internal::
          CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                    ((internal *)&local_48,"Method::PUT","parseMethod(\"PUT\")",local_50,&local_14);
          if (local_38[0] != local_28) {
            operator_delete(local_38[0]);
          }
          bVar1 = local_48.success_;
          if (local_48.success_ == false) {
            testing::Message::Message((Message *)local_38);
            if (local_48.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                       ,0x1e,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_38)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
            if (local_38[0] != (long *)0x0) {
              cVar2 = testing::internal::IsTrue(true);
              if ((cVar2 != '\0') && (local_38[0] != (long *)0x0)) {
                (**(code **)(*local_38[0] + 8))();
              }
              local_38[0] = (long *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_48.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (bVar1 != false) {
            local_50[0] = DELETE;
            local_38[0] = local_28;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"DELETE","");
            local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
            testing::internal::
            CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                      ((internal *)&local_48,"Method::DELETE","parseMethod(\"DELETE\")",local_50,
                       &local_14);
            if (local_38[0] != local_28) {
              operator_delete(local_38[0]);
            }
            bVar1 = local_48.success_;
            if (local_48.success_ == false) {
              testing::Message::Message((Message *)local_38);
              if (local_48.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_50,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                         ,0x1f,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_50,(Message *)local_38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
              testing::Message::~Message((Message *)local_38);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_48.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (bVar1 != false) {
              local_50[0] = TRACE;
              local_38[0] = local_28;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"TRACE","");
              local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
              testing::internal::
              CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                        ((internal *)&local_48,"Method::TRACE","parseMethod(\"TRACE\")",local_50,
                         &local_14);
              if (local_38[0] != local_28) {
                operator_delete(local_38[0]);
              }
              if (local_48.success_ == false) {
                testing::Message::Message((Message *)local_38);
                if (local_48.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                           ,0x20,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_50,(Message *)local_38);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
                testing::Message::~Message((Message *)local_38);
                testing::AssertionResult::~AssertionResult(&local_48);
              }
              else {
                testing::AssertionResult::~AssertionResult(&local_48);
                local_50[0] = CONNECT;
                local_38[0] = local_28;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"CONNECT","");
                local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
                testing::internal::
                CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                          ((internal *)&local_48,"Method::CONNECT","parseMethod(\"CONNECT\")",
                           local_50,&local_14);
                if (local_38[0] != local_28) {
                  operator_delete(local_38[0]);
                }
                if (local_48.success_ == false) {
                  testing::Message::Message((Message *)local_38);
                  if (local_48.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_50,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                             ,0x21,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_50,(Message *)local_38);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
                  testing::Message::~Message((Message *)local_38);
                  testing::AssertionResult::~AssertionResult(&local_48);
                }
                else {
                  testing::AssertionResult::~AssertionResult(&local_48);
                  local_50[0] = EXTENSION;
                  local_38[0] = local_28;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"post","");
                  local_14 = jaegertracing::net::http::parseMethod((string *)local_38);
                  testing::internal::
                  CmpHelperEQ<jaegertracing::net::http::Method,jaegertracing::net::http::Method>
                            ((internal *)&local_48,"Method::EXTENSION","parseMethod(\"post\")",
                             local_50,&local_14);
                  if (local_38[0] != local_28) {
                    operator_delete(local_38[0]);
                  }
                  if (local_48.success_ == false) {
                    testing::Message::Message((Message *)local_38);
                    if (local_48.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = ((local_48.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)local_50,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/http/MethodTest.cpp"
                               ,0x22,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)local_50,(Message *)local_38);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
                    testing::Message::~Message((Message *)local_38);
                  }
                  testing::AssertionResult::~AssertionResult(&local_48);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(Method, testParse)
{
    ASSERT_EQ(Method::OPTIONS, parseMethod("OPTIONS"));
    ASSERT_EQ(Method::GET, parseMethod("GET"));
    ASSERT_EQ(Method::HEAD, parseMethod("HEAD"));
    ASSERT_EQ(Method::POST, parseMethod("POST"));
    ASSERT_EQ(Method::PUT, parseMethod("PUT"));
    ASSERT_EQ(Method::DELETE, parseMethod("DELETE"));
    ASSERT_EQ(Method::TRACE, parseMethod("TRACE"));
    ASSERT_EQ(Method::CONNECT, parseMethod("CONNECT"));
    ASSERT_EQ(Method::EXTENSION, parseMethod("post"));
}